

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_ConstIterators_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ConstIterators_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pHVar1;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar2;
  char *in_R9;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  AssertHelper local_150;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_148;
  internal local_140 [8];
  undefined8 *local_138;
  pointer local_130;
  pointer local_128;
  pointer local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [40];
  iterator local_e0;
  nonempty_iterator local_d8;
  undefined1 local_d0 [80];
  iterator local_80;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_38;
  
  pHVar1 = &(this->
            super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  local_118._0_4_ = UniqueObjectHelper<int>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_d0,this_00,(const_reference)local_118);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin(&local_80,this_00);
  local_120 = local_80.pos.row_begin._M_current;
  local_128 = local_80.pos.row_end._M_current;
  local_d0._0_8_ = local_80.ht;
  local_d0._8_8_ = local_80.pos.row_begin._M_current;
  local_d0._16_8_ = local_80.pos.row_end._M_current;
  local_d0._24_8_ = local_80.pos.row_current._M_current;
  local_130 = (pointer)local_80.pos.col_current;
  local_d0._32_8_ = local_80.pos.col_current;
  local_d0._40_8_ = local_80.end.row_begin._M_current;
  local_d0._48_8_ = local_80.end.row_end._M_current;
  local_d0._56_8_ = local_80.end.row_current._M_current;
  local_d0._64_8_ = local_80.end.col_current;
  local_118._8_8_ =
       ((_Vector_impl_data *)
       ((long)&(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.table.groups + 0x10))->_M_start;
  local_108._0_8_ =
       *(pointer *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.table.groups + 0x18);
  local_108._16_8_ = (pointer)0x0;
  local_d8 = (nonempty_iterator)0x0;
  local_118._0_8_ = this_00;
  local_108._8_8_ = local_108._0_8_;
  local_108._24_8_ = local_118._8_8_;
  local_108._32_8_ = local_108._0_8_;
  local_e0._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_108._0_8_;
  local_d0._72_8_ = pHVar1;
  local_38 = pHVar1;
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_118);
  if (((local_120 == (pointer)local_118._8_8_) && (local_128 == (pointer)local_108._0_8_)) &&
     (local_80.pos.row_current._M_current ==
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_108._8_8_)) {
    if (local_80.pos.row_current._M_current == local_128) {
      local_140[0] = (internal)0x0;
    }
    else {
      local_140[0] = (internal)(local_130 != (pointer)local_108._16_8_);
      local_138 = (undefined8 *)0x0;
      if ((bool)local_140[0]) goto LAB_0065f53a;
    }
    local_138 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,local_140,(AssertionResult *)"it != this->ht_.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x10c,(char *)local_118._0_8_);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_118._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_108) {
      operator_delete((void *)local_118._0_8_);
    }
    if (local_148._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_148._M_head_impl + 8))();
    }
    puVar2 = local_138;
    if (local_138 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_138 != local_138 + 2) {
        operator_delete((undefined8 *)*local_138);
      }
      operator_delete(puVar2);
    }
  }
LAB_0065f53a:
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)local_d0);
  local_118._8_8_ =
       ((_Vector_impl_data *)
       ((long)&(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.table.groups + 0x10))->_M_start;
  local_108._0_8_ =
       *(pointer *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.table.groups + 0x18);
  local_108._16_8_ = (pointer)0x0;
  local_d8 = (nonempty_iterator)0x0;
  local_118._0_8_ = this_00;
  local_108._8_8_ = local_108._0_8_;
  local_108._24_8_ = local_118._8_8_;
  local_108._32_8_ = local_108._0_8_;
  local_e0._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_108._0_8_;
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_118);
  if (((local_d0._8_8_ == local_118._8_8_) && (local_d0._16_8_ == local_108._0_8_)) &&
     (local_d0._24_8_ == local_108._8_8_)) {
    if (local_108._8_8_ == local_108._0_8_) {
      return;
    }
    local_140[0] = (internal)(local_d0._32_8_ == local_108._16_8_);
    if ((bool)local_140[0]) {
      return;
    }
  }
  else {
    local_140[0] = (internal)0x0;
  }
  local_138 = (undefined8 *)0x0;
  testing::Message::Message((Message *)&local_148);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_118,local_140,(AssertionResult *)"it == this->ht_.end()","false","true"
             ,in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_150,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
             ,0x10e,(char *)local_118._0_8_);
  testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_148);
  testing::internal::AssertHelper::~AssertHelper(&local_150);
  if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       *)local_118._0_8_ !=
      (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       *)local_108) {
    operator_delete((void *)local_118._0_8_);
  }
  if (local_148._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_148._M_head_impl + 8))();
  }
  puVar2 = local_138;
  if (local_138 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_138 != local_138 + 2) {
      operator_delete((undefined8 *)*local_138);
    }
    operator_delete(puVar2);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstIterators) {
  this->ht_.insert(this->UniqueObject(1));
  typename TypeParam::const_iterator it = this->ht_.begin();
  EXPECT_TRUE(it != this->ht_.end());
  ++it;
  EXPECT_TRUE(it == this->ht_.end());
}